

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O1

Spectrum __thiscall
CMU462::StaticScene::AreaLight::sample_L
          (AreaLight *this,Vector3D *p,Vector3D *wi,float *distToLight,float *pdf)

{
  float fVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float __x;
  Spectrum SVar8;
  Sampler2D local_40;
  double local_38;
  
  UniformGridSampler2D::get_sample((UniformGridSampler2D *)&local_40);
  dVar2 = (double)local_40._vptr_Sampler2D + -0.5;
  local_38 = local_38 + -0.5;
  dVar5 = ((this->dim_y).x * local_38 + (this->dim_x).x * dVar2 + (this->position).x) - p->x;
  dVar6 = ((this->dim_y).y * local_38 + (this->dim_x).y * dVar2 + (this->position).y) - p->y;
  dVar2 = (local_38 * (this->dim_y).z + dVar2 * (this->dim_x).z + (this->position).z) - p->z;
  fVar7 = (float)((this->direction).z * dVar2 +
                 (this->direction).x * dVar5 + (this->direction).y * dVar6);
  __x = (float)(dVar2 * dVar2 + dVar5 * dVar5 + dVar6 * dVar6);
  if (__x < 0.0) {
    fVar1 = sqrtf(__x);
  }
  else {
    fVar1 = SQRT(__x);
  }
  dVar4 = 1.0 / (double)fVar1;
  wi->x = dVar5 * dVar4;
  wi->y = dVar6 * dVar4;
  wi->z = dVar2 * dVar4;
  *distToLight = fVar1;
  *pdf = __x / (ABS(fVar7) * this->area);
  if (fVar7 < 0.0) {
    uVar3._0_4_ = (this->radiance).r;
    uVar3._4_4_ = (this->radiance).g;
  }
  else {
    uVar3 = 0;
  }
  SVar8.b = (float)((uint)(this->radiance).b & -(uint)(fVar7 < 0.0));
  SVar8.r = (float)(int)uVar3;
  SVar8.g = (float)(int)((ulong)uVar3 >> 0x20);
  return SVar8;
}

Assistant:

Spectrum AreaLight::sample_L(const Vector3D& p, Vector3D* wi, 
                             float* distToLight, float* pdf) const {

  Vector2D sample = sampler.get_sample() - Vector2D(0.5f, 0.5f);
  Vector3D d = position + sample.x * dim_x + sample.y * dim_y - p;
  float cosTheta = dot(d, direction);
  float sqDist = d.norm2();
  float dist = sqrt(sqDist);
  *wi = d / dist;
  *distToLight = dist;
  *pdf = sqDist / (area * fabs(cosTheta));
  return cosTheta < 0 ? radiance : Spectrum();
}